

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O3

void * mi_new_nothrow(size_t size)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  
  if (size < 0x401) {
    lVar1 = *(long *)((long)(*(mi_heap_t **)(in_FS_OFFSET + -0x60))->pages_free_direct +
                     (size + 7 & 0xfffffffffffffff8));
    puVar2 = *(undefined8 **)(lVar1 + 0x10);
    if (puVar2 != (undefined8 *)0x0) {
      *(undefined8 *)(lVar1 + 0x10) = *puVar2;
      *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      return puVar2;
    }
  }
  sVar4 = size;
  pvVar3 = _mi_malloc_generic(*(mi_heap_t **)(in_FS_OFFSET + -0x60),size,false,0);
  if (pvVar3 != (void *)0x0) {
    return pvVar3;
  }
  pvVar3 = mi_try_new(size,SUB81(sVar4,0));
  return pvVar3;
}

Assistant:

void* mi_new_nothrow(size_t size) mi_attr_noexcept {
  void* p = mi_malloc(size);
  if mi_unlikely(p == NULL) return mi_try_new(size, true);
  return p;
}